

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

void __thiscall
DSBarInfo::DrawGraphic
          (DSBarInfo *this,FTexture *texture,SBarInfoCoordinate x,SBarInfoCoordinate y,int xOffset,
          int yOffset,double Alpha,bool fullScreenOffsets)

{
  undefined4 uVar1;
  undefined4 uVar3;
  double dVar2;
  bool bVar4;
  SBarInfo *pSVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  FRemapTable *pFVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dy;
  char in_stack_00000018;
  uint in_stack_00000020;
  char in_stack_00000028;
  int in_stack_00000030;
  double h;
  double w;
  byte in_stack_00000048;
  double dx;
  double local_78;
  double dcb;
  double dcy;
  double dcx;
  double dcr;
  double local_50;
  double local_48;
  double tmp;
  double local_38;
  
  if (texture == (FTexture *)0x0) {
    return;
  }
  dVar18 = (double)((int)x >> 1);
  dVar16 = (double)((int)y >> 1);
  uVar9 = ~in_stack_00000020;
  if ((uVar9 & 0x42) == 0) {
    if (in_stack_00000030 < 0) {
      dVar19 = (texture->Scale).X;
      dVar18 = dVar18 + (double)(int)texture->LeftOffset / dVar19 +
                        ((double)texture->Width / dVar19) * -0.5;
    }
    else {
      dVar19 = (texture->Scale).X;
      dVar18 = dVar18 - (0.5 - ((double)(int)texture->LeftOffset / dVar19) /
                               ((double)texture->Width / dVar19)) * (double)in_stack_00000030;
    }
    if (h._0_4_ < 0) {
      dVar19 = (texture->Scale).Y;
      dVar16 = dVar16 + (double)(int)texture->TopOffset / dVar19 +
                        ((double)texture->Height / dVar19) * -0.5;
      local_78 = dVar16;
    }
    else {
      dVar19 = (texture->Scale).Y;
      dVar16 = dVar16 - (0.5 - ((double)(int)texture->TopOffset / dVar19) /
                               ((double)texture->Height / dVar19)) * (double)h._0_4_;
      local_78 = dVar16;
    }
  }
  dVar18 = (double)xOffset + dVar18;
  dVar16 = (double)yOffset + dVar16;
  if (!fullScreenOffsets) {
    tmp = 0.0;
    local_38 = dVar18 + (double)*(int *)&(this->super_DBaseStatusBar).super_DObject.field_0x24;
    bVar4 = (this->super_DBaseStatusBar).Scaled;
    pSVar5 = this->script;
    iVar10 = 200;
    if (bVar4 == true) {
      iVar10 = pSVar5->resH;
    }
    local_78 = dVar16 + (double)(((this->super_DBaseStatusBar).ST_Y - iVar10) + pSVar5->height);
    if (in_stack_00000030 < 0) {
      local_48 = (double)texture->Width / (texture->Scale).X;
    }
    else {
      local_48 = (double)in_stack_00000030;
    }
    if (h._0_4_ < 0) {
      local_50 = (double)texture->Height / (texture->Scale).Y;
    }
    else {
      local_50 = (double)h._0_4_;
    }
    dVar18 = *(double *)w;
    dcy = 0.0;
    dcx = 0.0;
    if ((dVar18 != 0.0) || (NAN(dVar18))) {
      dcx = (local_38 + dVar18) - (double)(int)texture->LeftOffset / (texture->Scale).X;
    }
    dVar16 = *(double *)((long)w + 8);
    if ((dVar16 != 0.0) || (NAN(dVar16))) {
      dcy = (local_78 + dVar16) - (double)(int)texture->TopOffset / (texture->Scale).Y;
    }
    dVar19 = *(double *)((long)w + 0x10);
    dcb = 2147483647.0;
    dcr = 2147483647.0;
    if ((dVar19 != 0.0) || (NAN(dVar19))) {
      dcr = ((local_38 + local_48) - dVar19) - (double)(int)texture->LeftOffset / (texture->Scale).X
      ;
    }
    dVar19 = *(double *)((long)w + 0x18);
    if ((dVar19 != 0.0) || (NAN(dVar19))) {
      dcb = ((local_50 + local_78) - dVar19) - (double)(int)texture->TopOffset / (texture->Scale).Y;
    }
    if (bVar4 == false) {
      dVar18 = (double)(200 - pSVar5->resH);
      local_78 = local_78 + dVar18;
      dcy = dcy + dVar18;
      dcb = dcb + dVar18;
    }
    else {
      if ((((dVar18 != 0.0) || (NAN(dVar18))) || (dVar16 != 0.0)) || (NAN(dVar16))) {
        DCanvas::VirtualToRealCoords
                  ((DCanvas *)screen,&dcx,&dcy,&tmp,&tmp,(double)pSVar5->resW,(double)pSVar5->resH,
                   true,true);
        if ((*(double *)w == 0.0) && (!NAN(*(double *)w))) {
          dcx = 0.0;
        }
        if ((*(double *)((long)w + 8) == 0.0) && (!NAN(*(double *)((long)w + 8)))) {
          dcy = 0.0;
        }
      }
      if (((*(double *)((long)w + 0x10) != 0.0) || (NAN(*(double *)((long)w + 0x10)))) ||
         ((*(double *)((long)w + 0x18) == 0.0 & (in_stack_00000048 ^ 1)) == 0)) {
        DCanvas::VirtualToRealCoords
                  ((DCanvas *)screen,&dcr,&dcb,&tmp,&tmp,(double)this->script->resW,
                   (double)this->script->resH,true,true);
      }
      DCanvas::VirtualToRealCoords
                ((DCanvas *)screen,&local_38,&local_78,&local_48,&local_50,
                 (double)this->script->resW,(double)this->script->resH,true,true);
    }
    if (in_stack_00000048 != 0) {
      dVar18 = local_38;
      if (local_38 <= dcx) {
        dVar18 = dcx;
      }
      dVar16 = local_78;
      if (local_78 <= dcy) {
        dVar16 = dcy;
      }
      dVar19 = dcr;
      if (dVar18 + local_48 <= dcr) {
        dVar19 = dVar18 + local_48;
      }
      dVar17 = dcb;
      if (dVar16 + local_50 <= dcb) {
        dVar17 = dVar16 + local_50;
      }
      (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
                (screen,(ulong)(uint)(int)dVar18,(ulong)(uint)(int)dVar16,(ulong)(uint)(int)dVar19,
                 (ulong)(uint)(int)dVar17,(ulong)GPalette.BlackIndex,0);
      return;
    }
    uVar11 = (ulong)(uint)(int)dcx;
    uVar7 = (ulong)(uint)(int)dcy;
    dVar18 = 2147483647.0;
    if (dcr <= 2147483647.0) {
      dVar18 = dcr;
    }
    uVar8 = (ulong)(uint)(int)dVar18;
    dVar18 = 2147483647.0;
    if (dcb <= 2147483647.0) {
      dVar18 = dcb;
    }
    uVar15 = (ulong)(uint)(int)dVar18;
    uVar12 = 0;
    dVar18 = local_38;
    dVar16 = local_78;
    dVar19 = local_48;
    dVar17 = local_50;
    if (in_stack_00000028 != '\0') {
      if (dy._0_1_ == '\0') {
        pFVar14 = (FRemapTable *)0x0;
      }
      else {
        pFVar14 = translationtables
                  [(ulong)(((undefined1)gameinfo.gametype & GAME_Raven) != GAME_Any) + 1].
                  super_TArray<FRemapTablePtr,_FRemapTable_*>.Array
                  [(int)((ulong)&(this->super_DBaseStatusBar).CPlayer[-0x9192].secretcount >> 5) *
                   0x3cf3cf3d].Ptr;
      }
      uVar13 = 0xaa000000;
      if (in_stack_00000018 == '\0') {
        uVar13 = uVar12;
      }
      goto LAB_004c1ce2;
    }
    if (dy._0_1_ == '\0') {
      pFVar14 = (FRemapTable *)0x0;
    }
    else {
      pFVar14 = translationtables
                [(ulong)(((undefined1)gameinfo.gametype & GAME_Raven) != GAME_Any) + 1].
                super_TArray<FRemapTablePtr,_FRemapTable_*>.Array
                [(int)((ulong)&(this->super_DBaseStatusBar).CPlayer[-0x9192].secretcount >> 5) *
                 0x3cf3cf3d].Ptr;
    }
    if (in_stack_00000018 != '\0') {
      uVar12 = 0xaa000000;
    }
    goto LAB_004c1d63;
  }
  if (hud_scale.Value) {
    uVar1 = this->script->cleanX;
    uVar3 = this->script->cleanY;
    dVar20 = (double)(int)uVar1;
    dVar21 = (double)(int)uVar3;
  }
  else {
    dVar20 = 1.0;
    dVar21 = 1.0;
  }
  if (((uint)x & 1) != 0) {
    if (hud_scale.Value) {
      dVar19 = dVar20 + dVar20;
    }
    else {
      dVar19 = 2.0;
    }
    dVar18 = dVar18 + (double)(screen->super_DSimpleCanvas).super_DCanvas.Width / dVar19;
  }
  if (((uint)y & 1) != 0) {
    if (hud_scale.Value) {
      dVar19 = dVar21 + dVar21;
    }
    else {
      dVar19 = 2.0;
    }
    dVar16 = dVar16 + (double)(screen->super_DSimpleCanvas).super_DCanvas.Height / dVar19;
  }
  if (in_stack_00000030 < 0) {
    dVar19 = (double)texture->Width / (texture->Scale).X;
  }
  else {
    dVar19 = (double)in_stack_00000030;
  }
  if (h._0_4_ < 0) {
    dVar17 = (double)texture->Height / (texture->Scale).Y;
  }
  else {
    dVar17 = (double)h._0_4_;
  }
  if (vid_fps.Value) {
    dVar16 = (double)(~-(ulong)(dVar18 < 0.0) & (ulong)dVar16 |
                     (~-(ulong)(0.0 <= dVar16) & (ulong)dVar16 |
                     (ulong)(dVar16 + 10.0) & -(ulong)(0.0 <= dVar16)) & -(ulong)(dVar18 < 0.0));
  }
  if (hud_scale.Value) {
    dVar16 = dVar16 * dVar21;
    dVar19 = dVar19 * dVar20;
    dVar18 = dVar18 * dVar20;
    dVar17 = dVar17 * dVar21;
  }
  if ((int)x >> 1 < 0 && ((uint)x & 1) == 0) {
    dVar18 = (double)(screen->super_DSimpleCanvas).super_DCanvas.Width + dVar18;
  }
  if ((int)y >> 1 < 0 && ((uint)y & 1) == 0) {
    dVar16 = dVar16 + (double)(screen->super_DSimpleCanvas).super_DCanvas.Height;
  }
  dVar2 = *(double *)w;
  dVar22 = 0.0;
  if (((dVar2 != 0.0) || (NAN(dVar2))) ||
     ((*(double *)((long)w + 8) != 0.0 || (NAN(*(double *)((long)w + 8)))))) {
LAB_004c196e:
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar22 = (dVar2 - (double)(int)texture->LeftOffset / (texture->Scale).X) * dVar20 + dVar18;
    }
    dVar2 = *(double *)((long)w + 8);
    dVar23 = 0.0;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar23 = (dVar2 - (double)(int)texture->TopOffset / (texture->Scale).Y) * dVar21 + dVar16;
    }
    dVar2 = *(double *)((long)w + 0x10);
    dVar24 = 2147483647.0;
    dVar25 = 2147483647.0;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      dVar25 = (dVar18 + dVar19) -
               dVar20 * (dVar2 + (double)(int)texture->LeftOffset / (texture->Scale).X);
    }
    dVar20 = *(double *)((long)w + 0x18);
    if ((dVar20 != 0.0) || (NAN(dVar20))) {
      dVar24 = (dVar17 + dVar16) -
               dVar21 * (dVar20 + (double)(int)texture->TopOffset / (texture->Scale).Y);
    }
  }
  else {
    dVar23 = 0.0;
    if (((*(double *)((long)w + 0x10) != 0.0) || (NAN(*(double *)((long)w + 0x10)))) ||
       ((*(double *)((long)w + 0x18) != 0.0 || (NAN(*(double *)((long)w + 0x18))))))
    goto LAB_004c196e;
    dVar25 = 2147483647.0;
    dVar24 = 2147483647.0;
  }
  uVar6 = (uint)dVar22;
  uVar7 = (ulong)(uint)(int)dVar23;
  if (in_stack_00000048 != 0) {
    if (dVar22 + dVar19 <= dVar25) {
      dVar25 = dVar22 + dVar19;
    }
    if (dVar23 + dVar17 <= dVar24) {
      dVar24 = dVar23 + dVar17;
    }
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,(ulong)uVar6,uVar7,(ulong)(uint)(int)dVar25,(ulong)(uint)(int)dVar24,
               (ulong)GPalette.BlackIndex,0);
    return;
  }
  uVar8 = (ulong)(uint)(int)dVar25;
  uVar15 = (ulong)(uint)(int)dVar24;
  uVar12 = 0;
  if (in_stack_00000028 != '\0') {
    if (dy._0_1_ == '\0') {
      pFVar14 = (FRemapTable *)0x0;
    }
    else {
      pFVar14 = translationtables
                [(ulong)(((undefined1)gameinfo.gametype & GAME_Raven) != GAME_Any) + 1].
                super_TArray<FRemapTablePtr,_FRemapTable_*>.Array
                [(int)((ulong)&(this->super_DBaseStatusBar).CPlayer[-0x9192].secretcount >> 5) *
                 0x3cf3cf3d].Ptr;
    }
    uVar13 = 0xaa000000;
    if (in_stack_00000018 == '\0') {
      uVar13 = uVar12;
    }
    uVar11 = (ulong)uVar6;
LAB_004c1ce2:
    DCanvas::DrawTexture
              ((DCanvas *)screen,texture,dVar18,dVar16,0x400013af,dVar19,dVar17,Alpha,0x400013b0,
               0x400013a3,uVar11,0x400013a1,uVar7,0x400013a4,uVar8,0x400013a2,uVar15,0x4000138e,
               pFVar14,0x400013aa,uVar13,0x4000139e,(ulong)((uVar9 & 0x44) == 0),0x4000138c,
               0x4000138f,1,0x4000138d,0,0);
    return;
  }
  if (dy._0_1_ == '\0') {
    pFVar14 = (FRemapTable *)0x0;
  }
  else {
    pFVar14 = translationtables
              [(ulong)(((undefined1)gameinfo.gametype & GAME_Raven) != GAME_Any) + 1].
              super_TArray<FRemapTablePtr,_FRemapTable_*>.Array
              [(int)((ulong)&(this->super_DBaseStatusBar).CPlayer[-0x9192].secretcount >> 5) *
               0x3cf3cf3d].Ptr;
  }
  if (in_stack_00000018 != '\0') {
    uVar12 = 0xaa000000;
  }
  uVar11 = (ulong)uVar6;
LAB_004c1d63:
  DCanvas::DrawTexture
            ((DCanvas *)screen,texture,dVar18,dVar16,0x400013af,dVar19,dVar17,Alpha,0x400013b0,
             0x400013a3,uVar11,0x400013a1,uVar7,0x400013a4,uVar8,0x400013a2,uVar15,0x4000138e,
             pFVar14,0x400013aa,uVar12,0x4000139e,(ulong)((uVar9 & 0x44) == 0),0x4000138c,0);
  return;
}

Assistant:

void DrawGraphic(FTexture* texture, SBarInfoCoordinate x, SBarInfoCoordinate y, int xOffset, int yOffset, double Alpha, bool fullScreenOffsets, bool translate=false, bool dim=false, int offsetflags=0, bool alphaMap=false, int forceWidth=-1, int forceHeight=-1, const double *clip = nulclip, bool clearDontDraw=false) const
	{
		if (texture == NULL)
			return;

		double dx = *x;
		double dy = *y;

		if((offsetflags & SBarInfoCommand::CENTER) == SBarInfoCommand::CENTER)
		{
			if (forceWidth < 0)	dx -= (texture->GetScaledWidthDouble()/2.0)-texture->GetScaledLeftOffsetDouble();
			else	dx -= forceWidth*(0.5-(texture->GetScaledLeftOffsetDouble()/texture->GetScaledWidthDouble()));
			//Unoptimalized formula is dx -= forceWidth/2.0-(texture->GetScaledLeftOffsetDouble()*forceWidth/texture->GetScaledWidthDouble());
			
			if (forceHeight < 0)	dy -= (texture->GetScaledHeightDouble()/2.0)-texture->GetScaledTopOffsetDouble();
			else	dy -= forceHeight*(0.5-(texture->GetScaledTopOffsetDouble()/texture->GetScaledHeightDouble()));
		}

		dx += xOffset;
		dy += yOffset;
		double w, h;
		if(!fullScreenOffsets)
		{
			double tmp = 0;
			dx += ST_X;
			dy += ST_Y - (Scaled ? script->resH : 200) + script->height;
			w = forceWidth < 0 ? texture->GetScaledWidthDouble() : forceWidth;
			h = forceHeight < 0 ? texture->GetScaledHeightDouble() : forceHeight;
			double dcx = clip[0] == 0 ? 0 : dx + clip[0] - texture->GetScaledLeftOffsetDouble();
			double dcy = clip[1] == 0 ? 0 : dy + clip[1] - texture->GetScaledTopOffsetDouble();
			double dcr = clip[2] == 0 ? INT_MAX : dx + w - clip[2] - texture->GetScaledLeftOffsetDouble();
			double dcb = clip[3] == 0 ? INT_MAX : dy + h - clip[3] - texture->GetScaledTopOffsetDouble();

			if(Scaled)
			{
				if(clip[0] != 0 || clip[1] != 0)
				{
					screen->VirtualToRealCoords(dcx, dcy, tmp, tmp, script->resW, script->resH, true);
					if (clip[0] == 0) dcx = 0;
					if (clip[1] == 0) dcy = 0;
				}
				if(clip[2] != 0 || clip[3] != 0 || clearDontDraw)
					screen->VirtualToRealCoords(dcr, dcb, tmp, tmp, script->resW, script->resH, true);
				screen->VirtualToRealCoords(dx, dy, w, h, script->resW, script->resH, true);
			}
			else
			{
				dy += 200 - script->resH;
				dcy += 200 - script->resH;
				dcb += 200 - script->resH;
			}

			if(clearDontDraw)
				screen->Clear(static_cast<int>(MAX<double>(dx, dcx)), static_cast<int>(MAX<double>(dy, dcy)), static_cast<int>(MIN<double>(dcr,w+MAX<double>(dx, dcx))), static_cast<int>(MIN<double>(dcb,MAX<double>(dy, dcy)+h)), GPalette.BlackIndex, 0);
			else
			{
				if(alphaMap)
				{
					screen->DrawTexture(texture, dx, dy,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(dcx),
						DTA_ClipTop, static_cast<int>(dcy),
						DTA_ClipRight, static_cast<int>(MIN<double>(INT_MAX, dcr)),
						DTA_ClipBottom, static_cast<int>(MIN<double>(INT_MAX, dcb)),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						DTA_AlphaChannel, alphaMap,
						DTA_FillColor, 0,
						TAG_DONE);
				}
				else
				{
					screen->DrawTexture(texture, dx, dy,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(dcx),
						DTA_ClipTop, static_cast<int>(dcy),
						DTA_ClipRight, static_cast<int>(MIN<double>(INT_MAX, dcr)),
						DTA_ClipBottom, static_cast<int>(MIN<double>(INT_MAX, dcb)),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						TAG_DONE);
				}
			}
		}
		else
		{
			double rx, ry, rcx=0, rcy=0, rcr=INT_MAX, rcb=INT_MAX;

			double xScale = !hud_scale ? 1 : script->cleanX;
			double yScale = !hud_scale ? 1 : script->cleanY;

			adjustRelCenter(x.RelCenter(), y.RelCenter(), dx, dy, rx, ry, xScale, yScale);

			// We can't use DTA_HUDRules since it forces a width and height.
			// Translation: No high res.
			bool xright = *x < 0 && !x.RelCenter();
			bool ybot = *y < 0 && !y.RelCenter();

			w = (forceWidth < 0 ? texture->GetScaledWidthDouble() : forceWidth);
			h = (forceHeight < 0 ? texture->GetScaledHeightDouble() : forceHeight);
			if(vid_fps && rx < 0 && ry >= 0)
				ry += 10;
			if(hud_scale)
			{
				rx *= xScale;
				ry *= yScale;
				w *= xScale;
				h *= yScale;
			}
			if(xright)
				rx = SCREENWIDTH + rx;
			if(ybot)
				ry = SCREENHEIGHT + ry;

			// Check for clipping
			if(clip[0] != 0 || clip[1] != 0 || clip[2] != 0 || clip[3] != 0)
			{
				rcx = clip[0] == 0 ? 0 : rx+((clip[0] - texture->GetScaledLeftOffsetDouble())*xScale);
				rcy = clip[1] == 0 ? 0 : ry+((clip[1] - texture->GetScaledTopOffsetDouble())*yScale);
				rcr = clip[2] == 0 ? INT_MAX : rx+w-((clip[2] + texture->GetScaledLeftOffsetDouble())*xScale);
				rcb = clip[3] == 0 ? INT_MAX : ry+h-((clip[3] + texture->GetScaledTopOffsetDouble())*yScale);
			}

			if(clearDontDraw)
				screen->Clear(static_cast<int>(rcx), static_cast<int>(rcy), static_cast<int>(MIN<double>(rcr, rcx+w)), static_cast<int>(MIN<double>(rcb, rcy+h)), GPalette.BlackIndex, 0);
			else
			{
				if(alphaMap)
				{
					screen->DrawTexture(texture, rx, ry,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(rcx),
						DTA_ClipTop, static_cast<int>(rcy),
						DTA_ClipRight, static_cast<int>(rcr),
						DTA_ClipBottom, static_cast<int>(rcb),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						DTA_AlphaChannel, alphaMap,
						DTA_FillColor, 0,
						TAG_DONE);
				}
				else
				{
					screen->DrawTexture(texture, rx, ry,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(rcx),
						DTA_ClipTop, static_cast<int>(rcy),
						DTA_ClipRight, static_cast<int>(rcr),
						DTA_ClipBottom, static_cast<int>(rcb),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						TAG_DONE);
				}
			}
		}
	}